

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O0

void TestPreviousDouble(void)

{
  double dVar1;
  Double d2;
  Double d1;
  Double d0;
  double in_stack_ffffffffffffffa8;
  Double in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  
  double_conversion::Double::Double
            ((Double *)in_stack_ffffffffffffffb0.d64_,in_stack_ffffffffffffffa8);
  double_conversion::Double::PreviousDouble
            ((Double *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  CheckEqualsHelper(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
                    (double)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                    (char *)in_stack_ffffffffffffffb0.d64_,in_stack_ffffffffffffffa8);
  double_conversion::Double::Double
            ((Double *)in_stack_ffffffffffffffb0.d64_,in_stack_ffffffffffffffa8);
  double_conversion::Double::PreviousDouble
            ((Double *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  CheckEqualsHelper(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
                    (double)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                    (char *)in_stack_ffffffffffffffb0.d64_,in_stack_ffffffffffffffa8);
  double_conversion::Double::Double
            ((Double *)in_stack_ffffffffffffffb0.d64_,in_stack_ffffffffffffffa8);
  double_conversion::Double::PreviousDouble
            ((Double *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  double_conversion::Double::Double
            ((Double *)in_stack_ffffffffffffffb0.d64_,in_stack_ffffffffffffffa8);
  double_conversion::Double::Sign((Double *)in_stack_ffffffffffffffb0.d64_);
  CheckHelper(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
              (char *)in_stack_ffffffffffffffb0.d64_,
              SUB81((ulong)in_stack_ffffffffffffffa8 >> 0x38,0));
  double_conversion::Double::Double
            ((Double *)in_stack_ffffffffffffffb0.d64_,in_stack_ffffffffffffffa8);
  double_conversion::Double::PreviousDouble
            ((Double *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  CheckEqualsHelper(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
                    (double)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                    (char *)in_stack_ffffffffffffffb0.d64_,in_stack_ffffffffffffffa8);
  double_conversion::Double::Double
            ((Double *)in_stack_ffffffffffffffb0.d64_,in_stack_ffffffffffffffa8);
  double_conversion::Double::PreviousDouble
            ((Double *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  double_conversion::Double::Double
            ((Double *)in_stack_ffffffffffffffb0.d64_,in_stack_ffffffffffffffa8);
  double_conversion::Double::PreviousDouble
            ((Double *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  double_conversion::Double::Double
            ((Double *)in_stack_ffffffffffffffb0.d64_,in_stack_ffffffffffffffa8);
  double_conversion::Double::value((Double *)0x86ecbf);
  CheckEqualsHelper(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
                    (double)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                    (char *)in_stack_ffffffffffffffb0.d64_,in_stack_ffffffffffffffa8);
  double_conversion::Double::Sign((Double *)in_stack_ffffffffffffffb0.d64_);
  CheckHelper(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
              (char *)in_stack_ffffffffffffffb0.d64_,
              SUB81((ulong)in_stack_ffffffffffffffa8 >> 0x38,0));
  double_conversion::Double::value((Double *)0x86ed1c);
  CheckEqualsHelper(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
                    (double)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                    (char *)in_stack_ffffffffffffffb0.d64_,in_stack_ffffffffffffffa8);
  double_conversion::Double::Sign((Double *)in_stack_ffffffffffffffb0.d64_);
  CheckHelper(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
              (char *)in_stack_ffffffffffffffb0.d64_,
              SUB81((ulong)in_stack_ffffffffffffffa8 >> 0x38,0));
  double_conversion::Double::PreviousDouble
            ((Double *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  CheckEqualsHelper(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
                    (double)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                    (char *)in_stack_ffffffffffffffb0.d64_,in_stack_ffffffffffffffa8);
  double_conversion::Double::Infinity();
  double_conversion::Double::Double
            ((Double *)in_stack_ffffffffffffffb0.d64_,in_stack_ffffffffffffffa8);
  double_conversion::Double::PreviousDouble
            ((Double *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  CheckEqualsHelper(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
                    (double)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                    (char *)in_stack_ffffffffffffffb0.d64_,in_stack_ffffffffffffffa8);
  dVar1 = double_conversion::Double::Infinity();
  dVar1 = -dVar1;
  double_conversion::Double::Double((Double *)&stack0xffffffffffffffb0,0xffefffffffffffff);
  double_conversion::Double::PreviousDouble
            ((Double *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  CheckEqualsHelper(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
                    (double)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                    (char *)in_stack_ffffffffffffffb0.d64_,dVar1);
  return;
}

Assistant:

TEST(PreviousDouble) {
  CHECK_EQ(0.0, Double(4e-324).PreviousDouble());
  CHECK_EQ(-0.0, Double(0.0).PreviousDouble());
  CHECK(Double(Double(0.0).PreviousDouble()).Sign() < 0);
  CHECK_EQ(-4e-324, Double(-0.0).PreviousDouble());
  Double d0(4e-324);
  Double d1(d0.PreviousDouble());
  Double d2(d1.PreviousDouble());
  CHECK_EQ(0.0, d1.value());
  CHECK(d1.Sign() > 0);
  CHECK_EQ(-0.0, d2.value());
  CHECK(d2.Sign() < 0);
  CHECK_EQ(-4e-324, d2.PreviousDouble());
  CHECK_EQ(1.7976931348623157e308, Double(Double::Infinity()).PreviousDouble());
  CHECK_EQ(-Double::Infinity(),
           Double(DOUBLE_CONVERSION_UINT64_2PART_C(0xffefffff, ffffffff)).PreviousDouble());
}